

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t ZSTD_XXH64_digest(XXH64_state_t *state)

{
  xxh_u64 xVar1;
  xxh_u64 local_18;
  xxh_u64 h64;
  XXH64_state_t *state_local;
  
  if (state->total_len < 0x20) {
    local_18 = state->v[2] + 0x27d4eb2f165667c5;
  }
  else {
    xVar1 = XXH64_mergeRound((state->v[0] << 1 | (ulong)((long)state->v[0] < 0)) +
                             (state->v[1] << 7 | state->v[1] >> 0x39) +
                             (state->v[2] << 0xc | state->v[2] >> 0x34) +
                             (state->v[3] << 0x12 | state->v[3] >> 0x2e),state->v[0]);
    xVar1 = XXH64_mergeRound(xVar1,state->v[1]);
    xVar1 = XXH64_mergeRound(xVar1,state->v[2]);
    local_18 = XXH64_mergeRound(xVar1,state->v[3]);
  }
  xVar1 = XXH64_finalize(state->total_len + local_18,(xxh_u8 *)state->mem64,state->total_len,
                         XXH_aligned);
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t XXH64_digest(const XXH64_state_t* state)
{
    xxh_u64 h64;

    if (state->total_len >= 32) {
        h64 = XXH_rotl64(state->v[0], 1) + XXH_rotl64(state->v[1], 7) + XXH_rotl64(state->v[2], 12) + XXH_rotl64(state->v[3], 18);
        h64 = XXH64_mergeRound(h64, state->v[0]);
        h64 = XXH64_mergeRound(h64, state->v[1]);
        h64 = XXH64_mergeRound(h64, state->v[2]);
        h64 = XXH64_mergeRound(h64, state->v[3]);
    } else {
        h64  = state->v[2] /*seed*/ + XXH_PRIME64_5;
    }

    h64 += (xxh_u64) state->total_len;

    return XXH64_finalize(h64, (const xxh_u8*)state->mem64, (size_t)state->total_len, XXH_aligned);
}